

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O1

void test_abs<short>(uint length)

{
  short sVar1;
  ulong uVar2;
  int iVar3;
  undefined8 *puVar4;
  ulong uVar5;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  shared_ptr<short> pv;
  
  uVar2 = (ulong)length;
  iVar3 = posix_memalign(&pv.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                         ,0x10,(long)(int)length * 2);
  if (iVar3 != 0) {
    pv.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<short*,void(*)(short*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv,
             pv.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             sse::common::free<short>);
  if (0 < (int)length) {
    lVar6 = 0;
    p_Var7 = pv.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    do {
      *(short *)&p_Var7->_vptr__Sp_counted_base = (short)lVar6;
      lVar6 = lVar6 + -1;
      p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var7->_vptr__Sp_counted_base + 2);
    } while (-lVar6 != uVar2);
  }
  if (0 < (int)length) {
    uVar5 = 0;
    do {
      sVar1 = *(short *)((long)&(pv.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar5 * 2);
      if (sVar1 < 0) {
        *(short *)((long)&(pv.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + uVar5 * 2) = -sVar1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  if (0 < (int)length) {
    uVar5 = 0;
    do {
      if (0x8000 < *(ushort *)
                    ((long)&(pv.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base + uVar5 * 2)) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar4 = "void test_abs(unsigned int) [T = short]";
        *(undefined4 *)(puVar4 + 1) = 0x81;
        *(uint *)((long)puVar4 + 0xc) = length;
        __cxa_throw(puVar4,&Exception::typeinfo,0);
      }
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  if (pv.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_abs(unsigned length = 47)
{
    auto pv = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    T * v = pv.get();

    for (int i = 0; i < (int)length; ++i)
        v[i] = -i;

    simd::abs(v, v, length);

    for (int i = 0; i < (int)length; ++i)
    {
        if (v[i] < 0 && v[i] != std::numeric_limits<T>::min())
            FAIL();
    }
}